

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dmabuf_test.c
# Opt level: O0

int main(void)

{
  undefined4 uVar1;
  int iVar2;
  undefined1 *puVar3;
  char *pcVar4;
  int local_34;
  MPP_RET ret;
  RK_U8 *ptr;
  long lStack_20;
  RK_S32 fd;
  MppBuffer buf;
  MppBufferGroup grp;
  
  grp._4_4_ = 0;
  buf = (MppBuffer)0x0;
  lStack_20 = 0;
  _mpp_log_l(4,"mpp_dmabuf_test","mpp dmabuf test start\n",0);
  local_34 = mpp_buffer_group_get(&buf,0x20004,0,"mpp_dmabuf_test","main");
  if (local_34 == 0) {
    local_34 = mpp_buffer_get_with_tag
                         (buf,&stack0xffffffffffffffe0,0x100000,"mpp_dmabuf_test","main");
    if (local_34 == 0) {
      uVar1 = mpp_buffer_get_fd_with_caller(lStack_20,"main");
      puVar3 = (undefined1 *)mpp_buffer_get_ptr_with_caller(lStack_20,"main");
      local_34 = mpp_dmabuf_sync_begin(uVar1,0,"mpp_dmabuf_test");
      if (local_34 == 0) {
        *puVar3 = 0x61;
        puVar3[1] = 0x62;
        puVar3[2] = 99;
        puVar3[3] = 100;
        _mpp_log_l(4,"mpp_dmabuf_test","ioctl begin cpu access         success\n",0);
        local_34 = mpp_dmabuf_sync_end(uVar1,0,"mpp_dmabuf_test");
        if (local_34 == 0) {
          _mpp_log_l(4,"mpp_dmabuf_test","ioctl end cpu access           success\n",0);
          iVar2 = mpp_dmabuf_sync_partial_begin(uVar1,0,0,0x80000,"mpp_dmabuf_test");
          pcVar4 = "success";
          if (iVar2 != 0) {
            pcVar4 = "failed";
          }
          _mpp_log_l(4,"mpp_dmabuf_test","ioctl begin cpu access partial %s\n",0,pcVar4);
          iVar2 = mpp_dmabuf_sync_partial_end(uVar1,0,0,0x80000,"mpp_dmabuf_test");
          pcVar4 = "success";
          if (iVar2 != 0) {
            pcVar4 = "failed";
          }
          _mpp_log_l(4,"mpp_dmabuf_test","ioctl end cpu access partial   %s\n",0,pcVar4);
          iVar2 = mpp_dmabuf_set_name(uVar1,"dmabuf_test","mpp_dmabuf_test");
          pcVar4 = "success";
          if (iVar2 != 0) {
            pcVar4 = "failed";
          }
          _mpp_log_l(4,"mpp_dmabuf_test","ioctl set name                 %s\n",0,pcVar4);
          iVar2 = mpp_dmabuf_sync_partial_support();
          pcVar4 = "NO";
          if (iVar2 != 0) {
            pcVar4 = "YES";
          }
          _mpp_log_l(4,"mpp_dmabuf_test","ioctl sync partial             %s\n",0,pcVar4);
          local_34 = 0;
        }
        else {
          _mpp_log_l(2,"mpp_dmabuf_test","get dmaheap buffer sync begin failed ret %d\n",0,local_34)
          ;
        }
      }
      else {
        _mpp_log_l(2,"mpp_dmabuf_test","get dmaheap buffer sync begin failed ret %d\n",0,local_34);
      }
    }
    else {
      _mpp_log_l(2,"mpp_dmabuf_test","get 1M dmaheap buffer failed ret %d\n",0,local_34);
    }
  }
  else {
    _mpp_log_l(2,"mpp_dmabuf_test","get dmaheap buffer group failed ret %d\n",0,local_34);
  }
  if (lStack_20 != 0) {
    mpp_buffer_put_with_caller(lStack_20,"main");
    lStack_20 = 0;
  }
  if (buf != (MppBuffer)0x0) {
    mpp_buffer_group_put(buf);
    buf = (MppBuffer)0x0;
  }
  pcVar4 = "success";
  if (local_34 != 0) {
    pcVar4 = "failed";
  }
  _mpp_log_l(4,"mpp_dmabuf_test","mpp dmabuf test done %s\n",0,pcVar4);
  return 0;
}

Assistant:

int main()
{
    MppBufferGroup grp = NULL;
    MppBuffer buf = NULL;
    RK_S32 fd = -1;
    RK_U8 *ptr = NULL;
    MPP_RET ret = MPP_NOK;

    mpp_logi("mpp dmabuf test start\n");

    do {
        ret = mpp_buffer_group_get_internal(&grp, MPP_BUFFER_TYPE_DMA_HEAP | MPP_BUFFER_FLAGS_CACHABLE);
        if (ret) {
            mpp_loge("get dmaheap buffer group failed ret %d\n", ret);
            break;
        }

        ret = mpp_buffer_get(grp, &buf, SZ_1M);
        if (ret) {
            mpp_loge("get 1M dmaheap buffer failed ret %d\n", ret);
            break;
        }

        fd = mpp_buffer_get_fd(buf);
        ptr = mpp_buffer_get_ptr(buf);

        ret = mpp_dmabuf_sync_begin(fd, 0, MODULE_TAG);
        if (ret) {
            mpp_loge("get dmaheap buffer sync begin failed ret %d\n", ret);
            break;
        }

        ptr[0] = 'a';
        ptr[1] = 'b';
        ptr[2] = 'c';
        ptr[3] = 'd';

        mpp_logi("ioctl begin cpu access         success\n");

        ret = mpp_dmabuf_sync_end(fd, 0, MODULE_TAG);
        if (ret) {
            mpp_loge("get dmaheap buffer sync begin failed ret %d\n", ret);
            break;
        }

        mpp_logi("ioctl end cpu access           success\n");

        ret = mpp_dmabuf_sync_partial_begin(fd, 0, 0, SZ_512K, MODULE_TAG);
        mpp_logi("ioctl begin cpu access partial %s\n", ret ? "failed" : "success");

        ret = mpp_dmabuf_sync_partial_end(fd, 0, 0, SZ_512K, MODULE_TAG);
        mpp_logi("ioctl end cpu access partial   %s\n", ret ? "failed" : "success");

        ret = mpp_dmabuf_set_name(fd, "dmabuf_test", MODULE_TAG);
        mpp_logi("ioctl set name                 %s\n", ret ? "failed" : "success");

        ret = mpp_dmabuf_sync_partial_support();
        mpp_logi("ioctl sync partial             %s\n", ret ? "YES" : "NO");

        ret = MPP_OK;
    } while (0);

    if (buf) {
        mpp_buffer_put(buf);
        buf = NULL;
    }

    if (grp) {
        mpp_buffer_group_put(grp);
        grp = NULL;
    }

    mpp_logi("mpp dmabuf test done %s\n", ret ? "failed" : "success");

    return 0;
}